

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSignal.h
# Opt level: O3

void __thiscall
Simple::Lib::ProtoSignal<bool_(),_Simple::CollectorUntil0<bool>_>::ensure_ring
          (ProtoSignal<bool_(),_Simple::CollectorUntil0<bool>_> *this)

{
  int iVar1;
  SignalLink *pSVar2;
  _Any_data local_38;
  code *local_28;
  undefined8 uStack_20;
  
  if (this->callback_ring_ == (SignalLink *)0x0) {
    pSVar2 = (SignalLink *)operator_new(0x38);
    local_28 = (code *)0x0;
    uStack_20 = 0;
    local_38._M_unused._M_object = (void *)0x0;
    local_38._8_8_ = 0;
    pSVar2->next = (SignalLink *)0x0;
    pSVar2->prev = (SignalLink *)0x0;
    std::function<bool_()>::function(&pSVar2->function,(function<bool_()> *)&local_38);
    pSVar2->ref_count = 1;
    this->callback_ring_ = pSVar2;
    if (local_28 == (code *)0x0) {
      pSVar2->ref_count = 2;
    }
    else {
      (*local_28)(&local_38,&local_38,__destroy_functor);
      pSVar2 = this->callback_ring_;
      iVar1 = pSVar2->ref_count;
      pSVar2->ref_count = iVar1 + 1;
      if (iVar1 < 0) {
        __assert_fail("ref_count > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/billyquith[P]SimpleSignal/SimpleSignal.h"
                      ,0x51,
                      "void Simple::Lib::ProtoSignal<bool (), Simple::CollectorUntil0<bool>>::SignalLink::incref()"
                     );
      }
    }
    pSVar2->next = pSVar2;
    pSVar2->prev = pSVar2;
  }
  return;
}

Assistant:

void
  ensure_ring ()
  {
    if (!callback_ring_)
      {
        callback_ring_ = new SignalLink (CbFunction()); // ref_count = 1
        callback_ring_->incref(); // ref_count=2, head of ring, can be deactivated but not removed
        callback_ring_->next = callback_ring_; // ring head initialization
        callback_ring_->prev = callback_ring_; // ring tail initialization
      }
  }